

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::reopen(file_helper *this,bool truncate)

{
  spdlog_ex *this_00;
  uint uVar1;
  allocator local_39;
  string local_38;
  byte local_11;
  file_helper *pfStack_10;
  bool truncate_local;
  file_helper *this_local;
  
  local_11 = truncate;
  pfStack_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    open(this,(char *)&this->_filename,(uint)(local_11 & 1));
    return;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"Failed re opening file - was not opened before",&local_39);
  spdlog_ex::spdlog_ex(this_00,&local_38);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

void reopen(bool truncate)
    {
        if (_filename.empty())
        {
            throw spdlog_ex("Failed re opening file - was not opened before");
        }
        open(_filename, truncate);
    }